

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int MemHashReplace(unqlite_kv_engine *pKv,void *pKey,int nKeyLen,void *pData,unqlite_int64 nDataLen)

{
  sxu32 sVar1;
  mem_hash_record *pmVar2;
  void *local_58;
  void *pNew;
  sxu32 nData;
  mem_hash_record *pRecord;
  mem_hash_kv_engine *pEngine;
  unqlite_int64 nDataLen_local;
  void *pData_local;
  int nKeyLen_local;
  void *pKey_local;
  unqlite_kv_engine *pKv_local;
  
  if (nDataLen < 0x100000000) {
    pmVar2 = MemHashGetEntry((mem_hash_kv_engine *)pKv,pKey,nKeyLen);
    if (pmVar2 == (mem_hash_record *)0x0) {
      sVar1 = (*(code *)pKv[0x18].pIo)(pKey,nKeyLen);
      pmVar2 = MemHashNewRecord((mem_hash_kv_engine *)pKv,pKey,nKeyLen,pData,nDataLen,sVar1);
      if (pmVar2 == (mem_hash_record *)0x0) {
        return -1;
      }
      MemHashLinkRecord((mem_hash_kv_engine *)pKv,pmVar2);
      if (((uint)(*(int *)((long)&pKv[0x1a].pIo + 4) << 2) <= *(uint *)&pKv[0x1a].pIo) &&
         (*(uint *)&pKv[0x1a].pIo < 100000)) {
        MemHashGrowTable((mem_hash_kv_engine *)pKv);
      }
    }
    else {
      sVar1 = (sxu32)nDataLen;
      if (sVar1 == pmVar2->nDataLen) {
        local_58 = pmVar2->pData;
      }
      else {
        local_58 = SyMemBackendAlloc((SyMemBackend *)(pKv + 1),sVar1);
        if (local_58 == (void *)0x0) {
          return -1;
        }
        SyMemBackendFree((SyMemBackend *)(pKv + 1),pmVar2->pData);
      }
      pmVar2->nDataLen = sVar1;
      SyMemcpy(pData,local_58,sVar1);
      pmVar2->pData = local_58;
    }
    pKv_local._4_4_ = 0;
  }
  else {
    (*pKv->pIo->xErr)(pKv->pIo->pHandle,"Record size limit reached");
    pKv_local._4_4_ = -7;
  }
  return pKv_local._4_4_;
}

Assistant:

static int MemHashReplace(
	  unqlite_kv_engine *pKv,
	  const void *pKey,int nKeyLen,
	  const void *pData,unqlite_int64 nDataLen
	  )
{
	mem_hash_kv_engine *pEngine = (mem_hash_kv_engine *)pKv;
	mem_hash_record *pRecord;
	if( nDataLen > SXU32_HIGH ){
		/* Database limit */
		pEngine->pIo->xErr(pEngine->pIo->pHandle,"Record size limit reached");
		return UNQLITE_LIMIT;
	}
	/* Fetch the record first */
	pRecord = MemHashGetEntry(pEngine,pKey,nKeyLen);
	if( pRecord == 0 ){
		/* Allocate a new record */
		pRecord = MemHashNewRecord(pEngine,
			pKey,nKeyLen,
			pData,nDataLen,
			pEngine->xHash(pKey,nKeyLen)
			);
		if( pRecord == 0 ){
			return UNQLITE_NOMEM;
		}
		/* Link the entry */
		MemHashLinkRecord(pEngine,pRecord);
		if( (pEngine->nRecord >= pEngine->nBucket * MEM_HASH_FILL_FACTOR) && pEngine->nRecord < 100000 ){
			/* Rehash the table */
			MemHashGrowTable(pEngine);
		}
	}else{
		sxu32 nData = (sxu32)nDataLen;
		void *pNew;
		/* Replace an existing record */
		if( nData == pRecord->nDataLen ){
			/* No need to free the old chunk */
			pNew = (void *)pRecord->pData;
		}else{
			pNew = SyMemBackendAlloc(&pEngine->sAlloc,nData);
			if( pNew == 0 ){
				return UNQLITE_NOMEM;
			}
			/* Release the old data */
			SyMemBackendFree(&pEngine->sAlloc,(void *)pRecord->pData);
		}
		/* Reflect the change */
		pRecord->nDataLen = nData;
		SyMemcpy(pData,pNew,nData);
		pRecord->pData = pNew;
	}
	return UNQLITE_OK;
}